

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

bool __thiscall ON_PolyCurve::IsInPlane(ON_PolyCurve *this,ON_Plane *plane,double tolerance)

{
  ON_Curve *pOVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  lVar5 = (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if (lVar5 < 1) {
LAB_005900ef:
    cVar2 = '\0';
  }
  else {
    lVar4 = 0;
    do {
      pOVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar4];
      if (pOVar1 == (ON_Curve *)0x0) goto LAB_005900ef;
      iVar3 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x33])
                        (tolerance,pOVar1,plane);
      cVar2 = (char)iVar3;
    } while ((cVar2 != '\0') && (bVar6 = lVar5 + -1 != lVar4, lVar4 = lVar4 + 1, bVar6));
  }
  return (bool)cVar2;
}

Assistant:

bool
ON_PolyCurve::IsInPlane(
      const ON_Plane& plane, // plane to test
      double tolerance // tolerance to use when checking linearity
      ) const
{
  bool rc = false;
  int i, count = Count();
  for ( i = 0; i < count; i++ )
  {
    if ( !m_segment[i] )
      return false;
    rc = m_segment[i]->IsInPlane( plane, tolerance );
    if ( !rc )
      break;
  }
  return rc;
}